

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

int testOptionalInputs(void)

{
  int iVar1;
  bool bVar2;
  Normalizer *pNVar3;
  ostream *poVar4;
  Imputer *this;
  ostream *this_00;
  uint uVar5;
  char *pcVar6;
  allocator<char> local_f9;
  Model m3;
  Model m2;
  Model m4;
  undefined1 local_68 [40];
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  pNVar3 = CoreML::Specification::Model::_internal_mutable_normalizer(&m1);
  pNVar3->normtype_ = 2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&m2,"x",(allocator<char> *)&m3);
  addRequiredField(&m1,(string *)&m2);
  std::__cxx11::string::~string((string *)&m2);
  CoreML::validateOptional((Result *)&m2,&m1);
  bVar2 = CoreML::Result::good((Result *)&m2);
  std::__cxx11::string::~string((string *)&m2.super_MessageLite._internal_metadata_);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&m2,"y",(allocator<char> *)&m3);
    addOptionalField(&m1,(string *)&m2);
    std::__cxx11::string::~string((string *)&m2);
    CoreML::validateOptional((Result *)&m2,&m1);
    bVar2 = CoreML::Result::good((Result *)&m2);
    std::__cxx11::string::~string((string *)&m2.super_MessageLite._internal_metadata_);
    if (!bVar2) {
      CoreML::Specification::Model::Model(&m2);
      this = CoreML::Specification::Model::_internal_mutable_imputer(&m2);
      CoreML::Specification::Imputer::_internal_set_imputeddoublevalue(this,3.14);
      std::__cxx11::string::string<std::allocator<char>>((string *)&m3,"x",(allocator<char> *)&m4);
      addRequiredField(&m2,(string *)&m3);
      std::__cxx11::string::~string((string *)&m3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&m3,"y",(allocator<char> *)&m4);
      addOptionalField(&m2,(string *)&m3);
      std::__cxx11::string::~string((string *)&m3);
      CoreML::validateOptional((Result *)&m3,&m2);
      bVar2 = CoreML::Result::good((Result *)&m3);
      std::__cxx11::string::~string((string *)&m3.super_MessageLite._internal_metadata_);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&m3,"z",(allocator<char> *)&m4)
        ;
        addOptionalField(&m2,(string *)&m3);
        std::__cxx11::string::~string((string *)&m3);
        CoreML::validateOptional((Result *)&m3,&m2);
        bVar2 = CoreML::Result::good((Result *)&m3);
        std::__cxx11::string::~string((string *)&m3.super_MessageLite._internal_metadata_);
        if (!bVar2) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                  );
          this_00 = (ostream *)std::operator<<(poVar4,":");
          iVar1 = 0x40;
          goto LAB_00136478;
        }
        CoreML::Specification::Model::Model(&m3);
        CoreML::Specification::Model::_internal_mutable_treeensembleregressor(&m3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&m4,"x",(allocator<char> *)local_68);
        addRequiredField(&m3,(string *)&m4);
        std::__cxx11::string::~string((string *)&m4);
        CoreML::validateOptional((Result *)&m4,&m3);
        bVar2 = CoreML::Result::good((Result *)&m4);
        std::__cxx11::string::~string((string *)&m4.super_MessageLite._internal_metadata_);
        if (bVar2) {
          CoreML::Specification::Model::Model(&m4);
          CoreML::Specification::Model::_internal_mutable_treeensembleregressor(&m4);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"x",&local_f9);
          addOptionalField(&m4,(string *)local_68);
          std::__cxx11::string::~string((string *)local_68);
          CoreML::validateOptional((Result *)local_68,&m4);
          bVar2 = CoreML::Result::good((Result *)local_68);
          std::__cxx11::string::~string((string *)(local_68 + 8));
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                    );
            poVar4 = std::operator<<(poVar4,":");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4b);
            poVar4 = std::operator<<(poVar4,": error: ");
            poVar4 = std::operator<<(poVar4,"(validateOptional(m4)).good()");
            poVar4 = std::operator<<(poVar4," was false, expected true.");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          uVar5 = (uint)!bVar2;
          CoreML::Specification::Model::~Model(&m4);
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x46);
          poVar4 = std::operator<<(poVar4,": error: ");
          poVar4 = std::operator<<(poVar4,"(validateOptional(m3)).good()");
          poVar4 = std::operator<<(poVar4," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar4);
          uVar5 = 1;
        }
        CoreML::Specification::Model::~Model(&m3);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        this_00 = (ostream *)std::operator<<(poVar4,":");
        iVar1 = 0x3d;
LAB_00136478:
        poVar4 = (ostream *)std::ostream::operator<<(this_00,iVar1);
        poVar4 = std::operator<<(poVar4,": error: ");
        poVar4 = std::operator<<(poVar4,"(validateOptional(m2)).good()");
        poVar4 = std::operator<<(poVar4," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar5 = 1;
      }
      CoreML::Specification::Model::~Model(&m2);
      goto LAB_00136534;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x35);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = "!((validateOptional(m1)).good())";
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x32);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar6 = "(validateOptional(m1)).good()";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  poVar4 = std::operator<<(poVar4," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar5 = 1;
LAB_00136534:
  CoreML::Specification::Model::~Model(&m1);
  return uVar5;
}

Assistant:

int testOptionalInputs() {
    // Test that all fields are required on a random model (normalizer)
    Specification::Model m1;
    m1.mutable_normalizer()->set_normtype(Specification::Normalizer_NormType::Normalizer_NormType_L2);
    addRequiredField(m1, "x");
    ML_ASSERT_GOOD(validateOptional(m1));

    addOptionalField(m1, "y");
    ML_ASSERT_BAD(validateOptional(m1));

    // Test that at least one optional field is required on an imputer
    // (more than one allowed)
    Specification::Model m2;
    m2.mutable_imputer()->set_imputeddoublevalue(3.14);
    addRequiredField(m2, "x");
    addOptionalField(m2, "y");
    ML_ASSERT_GOOD(validateOptional(m2));

    addOptionalField(m2, "z");
    ML_ASSERT_GOOD(validateOptional(m2));

    // Test that any fields can be optional or required for trees
    Specification::Model m3;
    (void) m3.mutable_treeensembleregressor();
    addRequiredField(m3, "x");
    ML_ASSERT_GOOD(validateOptional(m3));

    Specification::Model m4;
    (void) m4.mutable_treeensembleregressor();
    addOptionalField(m4, "x");
    ML_ASSERT_GOOD(validateOptional(m4));

    return 0;
}